

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<json_out_callbacks>::multi_line_comment_body
          (pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<json_out_callbacks> *this,
          parser<json_out_callbacks> *parser,char c)

{
  bool bVar1;
  int iVar2;
  bool local_31;
  void *local_30;
  char local_21;
  parser<json_out_callbacks> *ppStack_20;
  char c_local;
  parser<json_out_callbacks> *parser_local;
  whitespace_matcher<json_out_callbacks> *this_local;
  
  local_21 = c;
  ppStack_20 = parser;
  parser_local = (parser<json_out_callbacks> *)this;
  this_local = (whitespace_matcher<json_out_callbacks> *)__return_storage_ptr__;
  bVar1 = parser<json_out_callbacks>::extension_enabled(parser,multi_line_comments);
  if (!bVar1) {
    assert_failed("parser.extension_enabled (extensions::multi_line_comments)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x605);
  }
  iVar2 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
  if (iVar2 == 6) {
    switch(local_21) {
    case '\t':
      break;
    case '\n':
      lf(this,ppStack_20);
      break;
    default:
      break;
    case '\r':
      cr(this,ppStack_20,multi_line_comment_crlf_state);
      break;
    case '*':
      matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,7);
    }
    local_30 = (void *)0x0;
    local_31 = true;
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
    ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_30,&local_31);
    return __return_storage_ptr__;
  }
  assert_failed("this->get_state () == multi_line_comment_body_state",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x606);
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::multi_line_comment_body (parser<Callbacks> & parser,
                                                                    char c) {
                using details::char_set;
                PSTORE_ASSERT (parser.extension_enabled (extensions::multi_line_comments));
                PSTORE_ASSERT (this->get_state () == multi_line_comment_body_state);
                switch (c) {
                case char_set::star:
                    // This could be a standalone star character or be followed by a slash
                    // to end the multi-line comment.
                    this->set_state (multi_line_comment_ending_state);
                    break;
                case char_set::cr: this->cr (parser, multi_line_comment_crlf_state); break;
                case char_set::lf: this->lf (parser); break;
                case char_set::tab: break; // TODO: tab expansion.
                default: break;            // Just consume.
                }
                return {nullptr, true}; // Consume this character.
            }